

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestInterfaceDynamicImpl::call
          (TestInterfaceDynamicImpl *this,Method method,
          CallContext<capnp::DynamicStruct,_capnp::DynamicStruct> context)

{
  Reader reader;
  bool bVar1;
  ReaderFor<bool> RVar2;
  ReaderFor<int> RVar3;
  PromiseNode *extraout_RDX;
  Type *func;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *pPVar4;
  long in_RSI;
  Promise<void> PVar5;
  undefined8 in_stack_fffffffffffffab0;
  Fault local_4c0;
  Fault f;
  CallContext<capnp::DynamicStruct,_capnp::DynamicStruct> *pCStack_4b0;
  bool _kj_shouldLog_2;
  Maybe<kj::Exception> local_4a8;
  ArrayPtr<const_char> local_348;
  Reader local_338;
  ReaderFor<capnp::DynamicStruct> local_2f0;
  undefined1 local_2b8 [8];
  Reader params_1;
  Reader local_268;
  ArrayPtr<const_char> local_220;
  Maybe<capnp::MessageSize> local_210;
  Builder local_1f8;
  bool local_1c1;
  undefined1 auStack_1c0 [7];
  bool _kj_shouldLog_1;
  Reader local_1b0;
  ArrayPtr<const_char> local_168;
  Reader local_158;
  ReaderFor<int> local_110;
  int local_10c;
  bool local_105;
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_f8;
  Reader local_e8;
  undefined1 local_a0 [8];
  Reader params;
  Reader local_58;
  undefined1 local_28 [8];
  Reader methodName;
  TestInterfaceDynamicImpl *this_local;
  
  InterfaceSchema::Method::getProto(&local_58,&method);
  _local_28 = (ArrayPtr<const_char>)capnp::schema::Method::Reader::getName(&local_58);
  kj::StringPtr::StringPtr((StringPtr *)&params.reader.nestingLimit,"foo");
  bVar1 = kj::StringPtr::operator==((StringPtr *)local_28,(StringPtr *)&params.reader.nestingLimit);
  if (bVar1) {
    **(int **)(in_RSI + 0x18) = **(int **)(in_RSI + 0x18) + 1;
    CallContext<capnp::DynamicStruct,_capnp::DynamicStruct>::getParams((Reader *)local_a0,&context);
    kj::StringPtr::StringPtr((StringPtr *)&local_f8,"i");
    DynamicStruct::Reader::get(&local_e8,(Reader *)local_a0,(StringPtr)local_f8);
    RVar3 = DynamicValue::Reader::as<int>(&local_e8);
    DynamicValue::Reader::~Reader(&local_e8);
    if (RVar3 != 0x7b) {
      local_105 = kj::_::Debug::shouldLog(ERROR);
      while (local_105 != false) {
        local_10c = 0x7b;
        kj::StringPtr::StringPtr((StringPtr *)&local_168,"i");
        DynamicStruct::Reader::get(&local_158,(Reader *)local_a0,(StringPtr)local_168);
        local_110 = DynamicValue::Reader::as<int>(&local_158);
        kj::_::Debug::log<char_const(&)[54],int,int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                   ,400,ERROR,
                   "\"failed: expected \" \"(123) == (params.get(\\\"i\\\").as<int>())\", 123, params.get(\"i\").as<int>()"
                   ,(char (*) [54])"failed: expected (123) == (params.get(\"i\").as<int>())",
                   &local_10c,&local_110);
        DynamicValue::Reader::~Reader(&local_158);
        local_105 = false;
      }
    }
    kj::StringPtr::StringPtr((StringPtr *)auStack_1c0,"j");
    DynamicStruct::Reader::get(&local_1b0,(Reader *)local_a0,(StringPtr)_auStack_1c0);
    RVar2 = DynamicValue::Reader::as<bool>(&local_1b0);
    DynamicValue::Reader::~Reader(&local_1b0);
    if (!RVar2) {
      local_1c1 = kj::_::Debug::shouldLog(ERROR);
      while (local_1c1 != false) {
        kj::_::Debug::log<char_const(&)[44]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                   ,0x191,ERROR,"\"failed: expected \" \"params.get(\\\"j\\\").as<bool>()\"",
                   (char (*) [44])"failed: expected params.get(\"j\").as<bool>()");
        local_1c1 = false;
      }
    }
    kj::Maybe<capnp::MessageSize>::Maybe(&local_210,(void *)0x0);
    CallContext<capnp::DynamicStruct,_capnp::DynamicStruct>::getResults
              (&local_1f8,&context,&local_210);
    kj::StringPtr::StringPtr((StringPtr *)&local_220,"x");
    DynamicValue::Reader::Reader(&local_268,"foo");
    DynamicStruct::Builder::set(&local_1f8,(StringPtr)local_220,&local_268);
    DynamicValue::Reader::~Reader(&local_268);
    kj::Maybe<capnp::MessageSize>::~Maybe(&local_210);
    kj::Promise<void>::Promise((Promise<void> *)this);
    pPVar4 = extraout_RDX;
  }
  else {
    kj::StringPtr::StringPtr((StringPtr *)&params_1.reader.nestingLimit,"baz");
    bVar1 = kj::StringPtr::operator==
                      ((StringPtr *)local_28,(StringPtr *)&params_1.reader.nestingLimit);
    if (bVar1) {
      **(int **)(in_RSI + 0x18) = **(int **)(in_RSI + 0x18) + 1;
      CallContext<capnp::DynamicStruct,_capnp::DynamicStruct>::getParams
                ((Reader *)local_2b8,&context);
      kj::StringPtr::StringPtr((StringPtr *)&local_348,"s");
      DynamicStruct::Reader::get(&local_338,(Reader *)local_2b8,(StringPtr)local_348);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_2f0,&local_338);
      reader.reader.segment = (SegmentReader *)local_2f0.reader.capTable;
      reader.schema.super_Schema.raw = (Schema)(Schema)local_2f0.reader.segment;
      reader.reader.capTable = (CapTableReader *)local_2f0.reader.data;
      reader.reader.data = local_2f0.reader.pointers;
      reader.reader.pointers = (WirePointer *)local_2f0.reader._32_8_;
      reader.reader.dataSize = local_2f0.reader.nestingLimit;
      reader.reader.pointerCount = local_2f0.reader._44_2_;
      reader.reader._38_2_ = local_2f0.reader._46_2_;
      reader.reader._40_8_ = in_stack_fffffffffffffab0;
      checkDynamicTestMessage(reader);
      DynamicValue::Reader::~Reader(&local_338);
      CallContext<capnp::DynamicStruct,_capnp::DynamicStruct>::releaseParams(&context);
      pCStack_4b0 = &context;
      kj::
      runCatchingExceptions<capnp::_::(anonymous_namespace)::TestInterfaceDynamicImpl::call(capnp::InterfaceSchema::Method,capnp::CallContext<capnp::DynamicStruct,capnp::DynamicStruct>)::_lambda()_1_>
                (&local_4a8,(kj *)&stack0xfffffffffffffb50,func);
      bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_4a8,(void *)0x0);
      kj::Maybe<kj::Exception>::~Maybe(&local_4a8);
      if (!bVar1) {
        f.exception._7_1_ = kj::_::Debug::shouldLog(ERROR);
        while ((bool)f.exception._7_1_ != false) {
          kj::_::Debug::log<char_const(&)[88]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                     ,0x199,ERROR,
                     "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { context.getParams(); }) != nullptr\""
                     ,(char (*) [88])
                      "failed: expected ::kj::runCatchingExceptions([&]() { context.getParams(); }) != nullptr"
                    );
          f.exception._7_1_ = false;
        }
      }
      kj::Promise<void>::Promise((Promise<void> *)this);
      pPVar4 = extraout_RDX_00;
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23],capnp::Text::Reader&>
                (&local_4c0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x19c,UNIMPLEMENTED,(char *)0x0,"\"Method not implemented\", methodName",
                 (char (*) [23])"Method not implemented",(Reader *)local_28);
      kj::_::Debug::Fault::~Fault(&local_4c0);
      kj::Promise<void>::Promise((Promise<void> *)this);
      pPVar4 = extraout_RDX_01;
    }
  }
  PVar5.super_PromiseBase.node.ptr = pPVar4;
  PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar5.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> call(InterfaceSchema::Method method,
                         CallContext<DynamicStruct, DynamicStruct> context) {
    auto methodName = method.getProto().getName();
    if (methodName == "foo") {
      ++callCount;
      auto params = context.getParams();
      EXPECT_EQ(123, params.get("i").as<int>());
      EXPECT_TRUE(params.get("j").as<bool>());
      context.getResults().set("x", "foo");
      return kj::READY_NOW;
    } else if (methodName == "baz") {
      ++callCount;
      auto params = context.getParams();
      checkDynamicTestMessage(params.get("s").as<DynamicStruct>());
      context.releaseParams();
      EXPECT_ANY_THROW(context.getParams());
      return kj::READY_NOW;
    } else {
      KJ_UNIMPLEMENTED("Method not implemented", methodName) { break; }
      return kj::READY_NOW;
    }
  }